

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase399::run(TestCase399 *this)

{
  bool bVar1;
  char *pcVar2;
  float fVar3;
  double dVar4;
  uint64_t local_150;
  unsigned_long_long local_148;
  bool local_139;
  uint64_t uStack_138;
  bool _kj_shouldLog_9;
  unsigned_long_long local_130;
  DebugExpression<unsigned_long_long> local_128;
  undefined1 local_120 [8];
  DebugComparison<unsigned_long_long,_unsigned_long> _kjCondition_9;
  bool local_f0;
  DebugExpression<bool> local_ef;
  bool local_ee;
  bool local_ed;
  DebugExpression<bool> local_ec;
  bool local_eb;
  bool local_ea;
  bool _kj_shouldLog_8;
  DebugExpression<bool> _kjCondition_8;
  bool _kj_shouldLog_7;
  DebugExpression<bool> _kjCondition_7;
  bool _kj_shouldLog_6;
  uint64_t uStack_e8;
  DebugExpression<bool> _kjCondition_6;
  unsigned_long_long local_e0;
  bool local_d1;
  uint64_t uStack_d0;
  bool _kj_shouldLog_5;
  unsigned_long_long local_c8;
  DebugExpression<unsigned_long_long> local_c0;
  undefined1 local_b8 [8];
  DebugComparison<unsigned_long_long,_unsigned_long> _kjCondition_5;
  bool local_85;
  uint32_t local_84;
  uint uStack_80;
  bool _kj_shouldLog_4;
  DebugExpression<unsigned_int> local_7c;
  undefined1 local_78 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_4;
  bool local_50;
  DebugExpression<bool> local_4f;
  bool local_4e;
  bool local_4d;
  DebugExpression<bool> local_4c;
  bool local_4b;
  bool local_4a;
  bool _kj_shouldLog_3;
  DebugExpression<bool> _kjCondition_3;
  bool _kj_shouldLog_2;
  uint32_t uStack_48;
  DebugExpression<bool> _kjCondition_2;
  bool _kj_shouldLog_1;
  DebugExpression<bool> _kjCondition_1;
  bool local_3d;
  uint32_t local_3c;
  uint uStack_38;
  bool _kj_shouldLog;
  DebugExpression<unsigned_int> local_34;
  undefined1 local_30 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition;
  TestCase399 *this_local;
  
  uStack_38 = 0x7fc00000;
  pcVar2 = "";
  _kjCondition._24_8_ = this;
  local_34 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffffc8);
  dVar4 = kj::nan(pcVar2);
  local_3c = mask<float>(SUB84(dVar4,0),0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_30,&local_34,&local_3c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_30);
  if (!bVar1) {
    pcVar2 = (char *)0x2;
    local_3d = kj::_::Debug::shouldLog(ERROR);
    while (local_3d != false) {
      __kjCondition_2 = 0x7fc00000;
      dVar4 = kj::nan(pcVar2);
      uStack_48 = mask<float>(SUB84(dVar4,0),0);
      pcVar2 = 
      "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
      ;
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,400,ERROR,
                 "\"failed: expected \" \"(0x7fc00000u) == (mask(kj::nan(), 0))\", _kjCondition, 0x7fc00000u, mask(kj::nan(), 0)"
                 ,(char (*) [55])"failed: expected (0x7fc00000u) == (mask(kj::nan(), 0))",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_30,(uint *)&_kjCondition_2,
                 &stack0xffffffffffffffb8);
      local_3d = false;
    }
  }
  fVar3 = unmask<float>(0x7fc00000,0);
  local_4a = isNan(fVar3);
  _kj_shouldLog_3 =
       (bool)kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_4a);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&_kj_shouldLog_3);
  if (!bVar1) {
    local_4b = kj::_::Debug::shouldLog(ERROR);
    while (local_4b != false) {
      kj::_::Debug::log<char_const(&)[54],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x191,ERROR,
                 "\"failed: expected \" \"isNan(unmask<float>(0x7fc00000u, 0))\", _kjCondition",
                 (char (*) [54])"failed: expected isNan(unmask<float>(0x7fc00000u, 0))",
                 (DebugExpression<bool> *)&_kj_shouldLog_3);
      local_4b = false;
    }
  }
  fVar3 = unmask<float>(0x7fc00001,0);
  local_4d = isNan(fVar3);
  local_4c = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_4d);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_4c);
  if (!bVar1) {
    local_4e = kj::_::Debug::shouldLog(ERROR);
    while (local_4e != false) {
      kj::_::Debug::log<char_const(&)[54],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x192,ERROR,
                 "\"failed: expected \" \"isNan(unmask<float>(0x7fc00001u, 0))\", _kjCondition",
                 (char (*) [54])"failed: expected isNan(unmask<float>(0x7fc00001u, 0))",&local_4c);
      local_4e = false;
    }
  }
  fVar3 = unmask<float>(0x7fc00005,0);
  local_50 = isNan(fVar3);
  local_4f = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_50);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_4f);
  if (!bVar1) {
    _kjCondition_4._31_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_4._31_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[54],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x193,ERROR,
                 "\"failed: expected \" \"isNan(unmask<float>(0x7fc00005u, 0))\", _kjCondition",
                 (char (*) [54])"failed: expected isNan(unmask<float>(0x7fc00005u, 0))",&local_4f);
      _kjCondition_4._31_1_ = 0;
    }
  }
  uStack_80 = 0x7fc00000;
  local_7c = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffff80);
  fVar3 = unmask<float>(0x7fc00000,0);
  local_84 = mask<float>(fVar3,0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_78,&local_7c,&local_84);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_78);
  if (!bVar1) {
    local_85 = kj::_::Debug::shouldLog(ERROR);
    while (local_85 != false) {
      _kjCondition_5._36_4_ = 0x7fc00000;
      fVar3 = unmask<float>(0x7fc00000,0);
      _kjCondition_5._32_4_ = mask<float>(fVar3,0);
      kj::_::Debug::
      log<char_const(&)[75],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x194,ERROR,
                 "\"failed: expected \" \"(0x7fc00000u) == (mask(unmask<float>(0x7fc00000u, 0), 0))\", _kjCondition, 0x7fc00000u, mask(unmask<float>(0x7fc00000u, 0), 0)"
                 ,(char (*) [75])
                  "failed: expected (0x7fc00000u) == (mask(unmask<float>(0x7fc00000u, 0), 0))",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_78,
                 (uint *)&_kjCondition_5.field_0x24,(uint *)&_kjCondition_5.result);
      local_85 = false;
    }
  }
  local_c8 = 0x7ff8000000000000;
  pcVar2 = "";
  local_c0 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c8);
  dVar4 = kj::nan(pcVar2);
  uStack_d0 = mask<double>((double)SUB84(dVar4,0),0);
  kj::_::DebugExpression<unsigned_long_long>::operator==
            ((DebugComparison<unsigned_long_long,_unsigned_long> *)local_b8,&local_c0,
             &stack0xffffffffffffff30);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b8);
  if (!bVar1) {
    pcVar2 = (char *)0x2;
    local_d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_d1 != false) {
      local_e0 = 0x7ff8000000000000;
      dVar4 = kj::nan(pcVar2);
      uStack_e8 = mask<double>((double)SUB84(dVar4,0),0);
      pcVar2 = 
      "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
      ;
      kj::_::Debug::
      log<char_const(&)[73],kj::_::DebugComparison<unsigned_long_long,unsigned_long>&,unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x195,ERROR,
                 "\"failed: expected \" \"(0x7ff8000000000000ull) == (mask((double)kj::nan(), 0))\", _kjCondition, 0x7ff8000000000000ull, mask((double)kj::nan(), 0)"
                 ,(char (*) [73])
                  "failed: expected (0x7ff8000000000000ull) == (mask((double)kj::nan(), 0))",
                 (DebugComparison<unsigned_long_long,_unsigned_long> *)local_b8,&local_e0,
                 &stack0xffffffffffffff18);
      local_d1 = false;
    }
  }
  dVar4 = unmask<double>(0x7ff8000000000000,0);
  local_ea = isNan(dVar4);
  _kj_shouldLog_8 =
       (bool)kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_ea);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&_kj_shouldLog_8);
  if (!bVar1) {
    local_eb = kj::_::Debug::shouldLog(ERROR);
    while (local_eb != false) {
      kj::_::Debug::log<char_const(&)[65],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x196,ERROR,
                 "\"failed: expected \" \"isNan(unmask<double>(0x7ff8000000000000ull, 0))\", _kjCondition"
                 ,(char (*) [65])"failed: expected isNan(unmask<double>(0x7ff8000000000000ull, 0))",
                 (DebugExpression<bool> *)&_kj_shouldLog_8);
      local_eb = false;
    }
  }
  dVar4 = unmask<double>(0x7ff8000000000001,0);
  local_ed = isNan(dVar4);
  local_ec = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_ed);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_ec);
  if (!bVar1) {
    local_ee = kj::_::Debug::shouldLog(ERROR);
    while (local_ee != false) {
      kj::_::Debug::log<char_const(&)[65],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x197,ERROR,
                 "\"failed: expected \" \"isNan(unmask<double>(0x7ff8000000000001ull, 0))\", _kjCondition"
                 ,(char (*) [65])"failed: expected isNan(unmask<double>(0x7ff8000000000001ull, 0))",
                 &local_ec);
      local_ee = false;
    }
  }
  dVar4 = unmask<double>(0x7ff8000000000005,0);
  local_f0 = isNan(dVar4);
  local_ef = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_f0);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_ef);
  if (!bVar1) {
    _kjCondition_9._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_9._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[65],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x198,ERROR,
                 "\"failed: expected \" \"isNan(unmask<double>(0x7ff8000000000005ull, 0))\", _kjCondition"
                 ,(char (*) [65])"failed: expected isNan(unmask<double>(0x7ff8000000000005ull, 0))",
                 &local_ef);
      _kjCondition_9._39_1_ = 0;
    }
  }
  local_130 = 0x7ff8000000000000;
  local_128 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_130);
  dVar4 = unmask<double>(0x7ff8000000000000,0);
  uStack_138 = mask<double>(dVar4,0);
  kj::_::DebugExpression<unsigned_long_long>::operator==
            ((DebugComparison<unsigned_long_long,_unsigned_long> *)local_120,&local_128,
             &stack0xfffffffffffffec8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_120);
  if (!bVar1) {
    local_139 = kj::_::Debug::shouldLog(ERROR);
    while (local_139 != false) {
      local_148 = 0x7ff8000000000000;
      dVar4 = unmask<double>(0x7ff8000000000000,0);
      local_150 = mask<double>(dVar4,0);
      kj::_::Debug::
      log<char_const(&)[96],kj::_::DebugComparison<unsigned_long_long,unsigned_long>&,unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x199,ERROR,
                 "\"failed: expected \" \"(0x7ff8000000000000ull) == (mask(unmask<double>(0x7ff8000000000000ull, 0), 0))\", _kjCondition, 0x7ff8000000000000ull, mask(unmask<double>(0x7ff8000000000000ull, 0), 0)"
                 ,(char (*) [96])
                  "failed: expected (0x7ff8000000000000ull) == (mask(unmask<double>(0x7ff8000000000000ull, 0), 0))"
                 ,(DebugComparison<unsigned_long_long,_unsigned_long> *)local_120,&local_148,
                 &local_150);
      local_139 = false;
    }
  }
  return;
}

Assistant:

TEST(WireFormat, NanPatching) {
  EXPECT_EQ(0x7fc00000u, mask(kj::nan(), 0));
  EXPECT_TRUE(isNan(unmask<float>(0x7fc00000u, 0)));
  EXPECT_TRUE(isNan(unmask<float>(0x7fc00001u, 0)));
  EXPECT_TRUE(isNan(unmask<float>(0x7fc00005u, 0)));
  EXPECT_EQ(0x7fc00000u, mask(unmask<float>(0x7fc00000u, 0), 0));
  EXPECT_EQ(0x7ff8000000000000ull, mask((double)kj::nan(), 0));
  EXPECT_TRUE(isNan(unmask<double>(0x7ff8000000000000ull, 0)));
  EXPECT_TRUE(isNan(unmask<double>(0x7ff8000000000001ull, 0)));
  EXPECT_TRUE(isNan(unmask<double>(0x7ff8000000000005ull, 0)));
  EXPECT_EQ(0x7ff8000000000000ull, mask(unmask<double>(0x7ff8000000000000ull, 0), 0));
}